

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgitems.cpp
# Opt level: O2

void __thiscall
icu_63::Package::enumDependencies(Package *this,Item *pItem,void *context,CheckDependency *check)

{
  byte bVar1;
  byte bVar2;
  uint32_t uVar3;
  int32_t idx;
  UDataInfo *pUVar4;
  long lVar5;
  char *pcVar6;
  int *suffix;
  size_t sVar7;
  UDataSwapper *ds;
  Item *item;
  ulong uVar8;
  char *pcVar9;
  int idLength;
  int *piVar10;
  int *piVar11;
  uint uVar12;
  int *__s;
  int *piVar13;
  FILE *pFVar14;
  uint uVar15;
  uint32_t *puVar16;
  byte *pbVar17;
  Package *in_stack_fffffffffffffe48;
  UErrorCode errorCode;
  int32_t itemHeaderLength;
  char *local_198;
  int32_t infoLength;
  NativeItem nativePool;
  ResourceData resData;
  NativeItem nrb;
  char local_f8 [200];
  
  errorCode = U_ZERO_ERROR;
  pUVar4 = getDataInfo(pItem->data,pItem->length,&infoLength,&itemHeaderLength,&errorCode);
  if (U_ZERO_ERROR < errorCode) {
    return;
  }
  piVar11 = &dataFormats;
  lVar5 = 0;
  while( true ) {
    if (lVar5 == 3) {
      return;
    }
    if (*piVar11 == *(int *)pUVar4->dataFormat) break;
    lVar5 = lVar5 + 1;
    piVar11 = piVar11 + 1;
  }
  if ((int)lVar5 == 1) {
    ds = udata_openSwapper_63(pUVar4->isBigEndian,pUVar4->charsetFamily,'\0','\0',&errorCode);
    pFVar14 = _stderr;
    if (U_ZERO_ERROR < errorCode) {
      pcVar6 = pItem->name;
      pcVar9 = u_errorName_63(errorCode);
      fprintf(pFVar14,"icupkg: udata_openSwapper(\"%s\") failed - %s\n",pcVar6,pcVar9);
      goto LAB_001ef9dc;
    }
    ds->printError = printError;
    pFVar14 = _stderr;
    ds->printErrorContext = _stderr;
    bVar1 = pUVar4->formatVersion[0];
    bVar2 = pUVar4->formatVersion[1];
    if ((bVar1 != 6) || (bVar2 < 2)) {
      pcVar6 = "icupkg/ucnv_enumDependencies(): .cnv format version %02x.%02x not supported\n";
LAB_001efa06:
      fprintf(pFVar14,pcVar6,(ulong)bVar1,(ulong)bVar2);
      exit(0x10);
    }
    uVar15 = pItem->length - itemHeaderLength;
    if ((int)uVar15 < 100) {
LAB_001ef681:
      pcVar6 = 
      "icupkg/ucnv_enumDependencies(): too few bytes (%d after header) for an ICU .cnv conversion table\n"
      ;
      uVar12 = uVar15;
LAB_001ef68e:
      udata_printError_63(ds,pcVar6,(ulong)uVar12);
      errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
    }
    else {
      puVar16 = (uint32_t *)(pItem->data + itemHeaderLength);
      local_198 = pItem->name;
      uVar3 = (*ds->readUInt32)(*puVar16);
      uVar12 = uVar15 - uVar3;
      if (uVar15 < uVar3) goto LAB_001ef681;
      if (*(char *)((long)puVar16 + 0x45) != '\x02') goto LAB_001ef69d;
      if ((int)uVar12 < 0x28) {
        pcVar6 = 
        "icupkg/ucnv_enumDependencies(): too few bytes (%d after headers) for an ICU MBCS .cnv conversion table\n"
        ;
        goto LAB_001ef68e;
      }
      pbVar17 = (byte *)((long)puVar16 + (ulong)uVar3);
      bVar1 = *pbVar17;
      uVar8 = (ulong)bVar1;
      if (bVar1 == 5) {
        uVar8 = 5;
        if (2 < pbVar17[1]) {
          uVar3 = (*ds->readUInt32)(*(uint32_t *)(pbVar17 + 0x20));
          if ((uVar3 & 0xff80) == 0) {
            uVar8 = (ulong)((uVar3 & 0x3f) << 2);
            goto LAB_001ef914;
          }
          uVar8 = (ulong)*pbVar17;
        }
LAB_001ef8bf:
        udata_printError_63(ds,
                            "icupkg/ucnv_enumDependencies(): unsupported _MBCSHeader.version %d.%d\n"
                            ,uVar8,(ulong)pbVar17[1]);
LAB_001ef8d8:
        errorCode = U_UNSUPPORTED_ERROR;
      }
      else {
        if (bVar1 != 4) goto LAB_001ef8bf;
        if (pbVar17[1] == 0) {
          uVar8 = 4;
          goto LAB_001ef8bf;
        }
        uVar8 = 0x20;
LAB_001ef914:
        uVar3 = (*ds->readUInt32)(*(uint32_t *)(pbVar17 + 0x18));
        if ((char)uVar3 == '\x0e') {
          if (uVar12 < (uVar3 >> 8) + 0x80) {
            pcVar6 = 
            "icupkg/ucnv_enumDependencies(): too few bytes (%d after headers) for an ICU MBCS .cnv conversion table with extension data\n"
            ;
            goto LAB_001ef68e;
          }
          sVar7 = strlen((char *)(pbVar17 + uVar8));
          if ((int)sVar7 < 0x20) {
            (*ds->swapInvChars)(ds,pbVar17 + uVar8,(int)sVar7 + 1,local_f8,&errorCode);
            checkIDSuffix(local_198,local_f8,-1,".cnv",check,context,&errorCode);
            goto LAB_001ef69d;
          }
          udata_printError_63(ds,"icupkg/ucnv_enumDependencies(%s): base name length %ld too long\n"
                              ,local_198,sVar7 & 0xffffffff);
          goto LAB_001ef8d8;
        }
      }
    }
LAB_001ef69d:
    udata_closeSwapper_63(ds);
  }
  else if ((int)lVar5 == 0) {
    NativeItem::NativeItem(&nrb,pItem,ures_swap_63);
    piVar11 = (int *)pItem->name;
    res_read_63(&resData,nrb.pInfo,nrb.bytes,nrb.length,&errorCode);
    if (U_ZERO_ERROR < errorCode) {
      bVar1 = (nrb.pInfo)->formatVersion[0];
      bVar2 = (nrb.pInfo)->formatVersion[1];
      pcVar6 = "icupkg: .res format version %02x.%02x not supported, or bundle malformed\n";
      pFVar14 = _stderr;
      goto LAB_001efa06;
    }
    if (((1 < (nrb.pInfo)->formatVersion[0]) ||
        (((nrb.pInfo)->formatVersion[0] == 1 && ((nrb.pInfo)->formatVersion[1] != '\0')))) &&
       (resData.noFallback == '\0')) {
      pcVar6 = strrchr((char *)piVar11,0x2f);
      __s = (int *)(pcVar6 + 1);
      if (pcVar6 == (char *)0x0) {
        __s = piVar11;
      }
      suffix = (int *)strrchr((char *)__s,0x2e);
      if (suffix == (int *)0x0) {
        sVar7 = strlen((char *)__s);
        suffix = (int *)(sVar7 + (long)__s);
      }
      idLength = 4;
      piVar13 = suffix;
      do {
        piVar10 = piVar13;
        if (piVar13 <= __s) break;
        piVar10 = (int *)((long)piVar13 + -1);
        pcVar6 = (char *)((long)piVar13 + -1);
        piVar13 = piVar10;
      } while (*pcVar6 != '_');
      if (piVar10 == __s) {
        pcVar6 = "root";
        if (((long)suffix - (long)__s == 4) && (*__s == 0x746f6f72)) goto LAB_001ef70a;
      }
      else {
        idLength = (int)piVar10 - (int)__s;
        pcVar6 = (char *)__s;
      }
      in_stack_fffffffffffffe48 = (Package *)&errorCode;
      checkIDSuffix((char *)piVar11,pcVar6,idLength,(char *)suffix,check,context,&errorCode);
    }
LAB_001ef70a:
    nativePool.length = 0;
    nativePool.bytes = (uint8_t *)0x0;
    nativePool.swapped = (uint8_t *)0x0;
    nativePool.pItem = (Item *)0x0;
    nativePool.pInfo = (UDataInfo *)0x0;
    if (resData.usesPoolBundle == '\0') {
LAB_001ef7ff:
      ures_enumDependencies
                ((char *)piVar11,&resData,resData.rootRes,(char *)0x0,(char *)0x0,0,check,context,
                 (Package *)&errorCode,(UErrorCode *)CONCAT44(itemHeaderLength,errorCode));
    }
    else {
      makeTargetName((char *)piVar11,"pool",4,".res",local_f8,(int32_t)&errorCode,
                     (UErrorCode *)in_stack_fffffffffffffe48);
      if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        (*check)(context,(char *)piVar11,local_f8);
        idx = findItem(this,local_f8,-1);
        if (-1 < idx) {
          item = getItem(this,idx);
          NativeItem::setItem(&nativePool,item,ures_swap_63);
          if ((((nativePool.pInfo)->formatVersion[0] < 2) || (nativePool.bytes[4] < 8)) ||
             ((nativePool.bytes[0x18] & 2) == 0)) {
            fprintf(_stderr,"icupkg: %s is not a pool bundle\n",local_f8);
          }
          else {
            if (resData.pRoot[8] == *(int *)(nativePool.bytes + 0x20)) {
              resData.poolBundleKeys =
                   (char *)(nativePool.bytes + (ulong)nativePool.bytes[4] * 4 + 4);
              resData.poolBundleStrings =
                   (uint16_t *)(nativePool.bytes + (long)*(int *)(nativePool.bytes + 8) * 4);
              goto LAB_001ef7ff;
            }
            fprintf(_stderr,"icupkg: %s has mismatched checksum for %s\n",local_f8,piVar11);
          }
        }
      }
    }
    NativeItem::~NativeItem(&nativePool);
    NativeItem::~NativeItem(&nrb);
  }
  if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    return;
  }
LAB_001ef9dc:
  exit(errorCode);
}

Assistant:

void
Package::enumDependencies(Item *pItem, void *context, CheckDependency check) {
    int32_t infoLength, itemHeaderLength;
    UErrorCode errorCode=U_ZERO_ERROR;
    const UDataInfo *pInfo=getDataInfo(pItem->data, pItem->length, infoLength, itemHeaderLength, &errorCode);
    if(U_FAILURE(errorCode)) {
        return; // should not occur because readFile() checks headers
    }

    // find the data format and call the corresponding function, if any
    int32_t format=getDataFormat(pInfo->dataFormat);
    if(format>=0) {
        switch(format) {
        case FMT_RES:
            {
                /*
                 * Swap the resource bundle (if necessary) so that we can use
                 * the normal runtime uresdata.c code to read it.
                 * We do not want to duplicate that code, especially not together with on-the-fly swapping.
                 */
                NativeItem nrb(pItem, ures_swap);
                ures_enumDependencies(pItem->name, nrb.getDataInfo(), nrb.getBytes(), nrb.getLength(), check, context, this, &errorCode);
                break;
            }
        case FMT_CNV:
            {
                // TODO: share/cache swappers
                UDataSwapper *ds=udata_openSwapper(
                                    (UBool)pInfo->isBigEndian, pInfo->charsetFamily,
                                    U_IS_BIG_ENDIAN, U_CHARSET_FAMILY,
                                    &errorCode);
                if(U_FAILURE(errorCode)) {
                    fprintf(stderr, "icupkg: udata_openSwapper(\"%s\") failed - %s\n",
                            pItem->name, u_errorName(errorCode));
                    exit(errorCode);
                }

                ds->printError=printError;
                ds->printErrorContext=stderr;

                const uint8_t *inBytes=pItem->data+itemHeaderLength;
                int32_t length=pItem->length-itemHeaderLength;

                ucnv_enumDependencies(ds, pItem->name, pInfo, inBytes, length, check, context, &errorCode);
                udata_closeSwapper(ds);
                break;
            }
        default:
            break;
        }

        if(U_FAILURE(errorCode)) {
            exit(errorCode);
        }
    }
}